

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

size_t zng_gzfread(void *buf,size_t size,size_t nitems,gzFile file)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  gz_state *in_RCX;
  gz_state *in_RDX;
  ulong in_RSI;
  gz_state *state;
  size_t len;
  ulong local_40;
  char *in_stack_ffffffffffffffd0;
  ulong local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else if (in_RCX == (gz_state *)0x0) {
    local_8 = 0;
  }
  else if ((in_RCX->mode == 0x1c4f) && ((in_RCX->err == 0 || (in_RCX->err == -5)))) {
    if ((in_RSI == 0) ||
       (auVar1._8_8_ = 0, auVar1._0_8_ = in_RSI,
       in_RDX <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0))) {
      if ((void *)((long)in_RDX * in_RSI) == (void *)0x0) {
        local_40 = 0;
      }
      else {
        sVar2 = gz_read(in_RCX,(void *)((long)in_RDX * in_RSI),(size_t)in_RCX);
        local_40 = sVar2 / in_RSI;
      }
      local_8 = local_40;
    }
    else {
      gz_error(in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t Z_EXPORT PREFIX(gzfread)(void *buf, size_t size, size_t nitems, gzFile file) {
    size_t len;
    gz_state *state;

    /* Exit early if size is zero, also prevents potential division by zero */
    if (size == 0)
        return 0;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return 0;

    /* compute bytes to read -- error on overflow */
    if (size && SIZE_MAX / size < nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }
    len = nitems * size;

    /* read len or fewer bytes to buf, return the number of full items read */
    return len ? gz_read(state, buf, len) / size : 0;
}